

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnumeric_p.h
# Opt level: O2

enable_if_t<std::is_integral_v<long_long>,_bool>
anon_unknown.dwarf_a6f413::convertDoubleTo<long_long>
          (double v,longlong *value,bool allow_precision_upgrade)

{
  long lVar1;
  
  if (ABS(v) <= 9007199254740992.0 || allow_precision_upgrade) {
    lVar1 = (long)v;
    *value = lVar1;
    if ((lVar1 != -0x8000000000000000) || (v == -9.223372036854776e+18)) {
      return v == (double)lVar1;
    }
    if (0.0 < v) {
      *value = 0x7fffffffffffffff;
    }
  }
  return false;
}

Assistant:

static inline std::enable_if_t<std::is_integral_v<T>, bool>
convertDoubleTo(double v, T *value, bool allow_precision_upgrade = true)
{
    static_assert(std::is_integral_v<T>);
    constexpr bool TypeIsLarger = std::numeric_limits<T>::digits > std::numeric_limits<double>::digits;

    if constexpr (TypeIsLarger) {
        using S = std::make_signed_t<T>;
        constexpr S max_mantissa = S(1) << std::numeric_limits<double>::digits;
        // T has more bits than double's mantissa, so don't allow "upgrading"
        // to T (makes it look like the number had more precision than really
        // was transmitted)
        if (!allow_precision_upgrade && !(v <= double(max_mantissa) && v >= double(-max_mantissa - 1)))
            return false;
    }

    constexpr T Tmin = (std::numeric_limits<T>::min)();
    constexpr T Tmax = (std::numeric_limits<T>::max)();

    // The [conv.fpint] (7.10 Floating-integral conversions) section of the C++
    // standard says only exact conversions are guaranteed. Converting
    // integrals to floating-point with loss of precision has implementation-
    // defined behavior whether the next higher or next lower is returned;
    // converting FP to integral is UB if it can't be represented.
    //
    // That means we can't write UINT64_MAX+1. Writing ldexp(1, 64) would be
    // correct, but Clang, ICC and MSVC don't realize that it's a constant and
    // the math call stays in the compiled code.

#if defined(Q_PROCESSOR_X86_64) && defined(__SSE2__)
    // Of course, UB doesn't apply if we use intrinsics, in which case we are
    // allowed to dpeend on exactly the processor's behavior. This
    // implementation uses the truncating conversions from Scalar Double to
    // integral types (CVTTSD2SI and VCVTTSD2USI), which is documented to
    // return the "indefinite integer value" if the range of the target type is
    // exceeded. (only implemented for x86-64 to avoid having to deal with the
    // non-existence of the 64-bit intrinsics on i386)

    if (std::numeric_limits<T>::is_signed) {
        __m128d mv = _mm_set_sd(v);
#  ifdef __AVX512F__
        // use explicit round control and suppress exceptions
        if (sizeof(T) > 4)
            *value = T(_mm_cvtt_roundsd_i64(mv, _MM_FROUND_TO_NEAREST_INT | _MM_FROUND_NO_EXC));
        else
            *value = _mm_cvtt_roundsd_i32(mv, _MM_FROUND_TO_NEAREST_INT | _MM_FROUND_NO_EXC);
#  else
        *value = sizeof(T) > 4 ? T(_mm_cvttsd_si64(mv)) : _mm_cvttsd_si32(mv);
#  endif

        // if *value is the "indefinite integer value", check if the original
        // variable \a v is the same value (Tmin is an exact representation)
        if (*value == Tmin && !_mm_ucomieq_sd(mv, _mm_set_sd(Tmin))) {
            // v != Tmin, so it was out of range
            if (v > 0)
                *value = Tmax;
            return false;
        }

        // convert the integer back to double and compare for equality with v,
        // to determine if we've lost any precision
        __m128d mi = _mm_setzero_pd();
        mi = sizeof(T) > 4 ? _mm_cvtsi64_sd(mv, *value) : _mm_cvtsi32_sd(mv, *value);
        return _mm_ucomieq_sd(mv, mi);
    }

#  ifdef __AVX512F__
    if (!std::numeric_limits<T>::is_signed) {
        // Same thing as above, but this function operates on absolute values
        // and the "indefinite integer value" for the 64-bit unsigned
        // conversion (Tmax) is not representable in double, so it can never be
        // the result of an in-range conversion. This is implemented for AVX512
        // and later because of the unsigned conversion instruction. Converting
        // to unsigned without losing an extra bit of precision prior to AVX512
        // is left to the compiler below.

        v = fabs(v);
        __m128d mv = _mm_set_sd(v);

        // use explicit round control and suppress exceptions
        if (sizeof(T) > 4)
            *value = T(_mm_cvtt_roundsd_u64(mv, _MM_FROUND_TO_NEAREST_INT | _MM_FROUND_NO_EXC));
        else
            *value = _mm_cvtt_roundsd_u32(mv, _MM_FROUND_TO_NEAREST_INT | _MM_FROUND_NO_EXC);

        if (*value == Tmax) {
            // no double can have an exact value of quint64(-1), but they can
            // quint32(-1), so we need to compare for that
            if (TypeIsLarger || _mm_ucomieq_sd(mv, _mm_set_sd(Tmax)))
                return false;
        }

        // return true if it was an exact conversion
        __m128d mi = _mm_setzero_pd();
        mi = sizeof(T) > 4 ? _mm_cvtu64_sd(mv, *value) : _mm_cvtu32_sd(mv, *value);
        return _mm_ucomieq_sd(mv, mi);
    }
#  endif
#endif

    double supremum;
    if (std::numeric_limits<T>::is_signed) {
        supremum = -1.0 * Tmin;     // -1 * (-2^63) = 2^63, exact (for T = qint64)
        *value = Tmin;
        if (v < Tmin)
            return false;
    } else {
        using ST = typename std::make_signed<T>::type;
        supremum = -2.0 * (std::numeric_limits<ST>::min)();   // -2 * (-2^63) = 2^64, exact (for T = quint64)
        v = fabs(v);
    }

    *value = Tmax;
    if (v >= supremum)
        return false;

    // Now we can convert, these two conversions cannot be UB
    *value = T(v);

QT_WARNING_PUSH
QT_WARNING_DISABLE_FLOAT_COMPARE

    return *value == v;

QT_WARNING_POP
}